

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdUnblindIssuance(void *handle,char *tx_hex_string,uint32_t tx_in_index,
                      char *asset_blinding_key,char *token_blinding_key,char **asset,
                      int64_t *asset_value,char **asset_blind_factor,char **asset_value_blind_factor
                      ,char **token,int64_t *token_value,char **token_blind_factor,
                      char **token_value_blind_factor)

{
  pointer puVar1;
  pointer pUVar2;
  bool bVar3;
  int64_t iVar4;
  CfdException *this;
  Amount AVar5;
  char *work_asset_blind_factor;
  char *work_asset;
  UnblindParameter unblind_asset;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> unblind_datas;
  UnblindParameter unblind_token;
  ConfidentialTransactionController ctxc;
  undefined1 local_258 [16];
  char local_248 [16];
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  void *local_208;
  char **local_200;
  undefined1 local_1f8 [40];
  BlindFactor local_1d0;
  BlindFactor local_1b0;
  ConfidentialValue local_190;
  Privkey local_168;
  Privkey local_148;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> local_128;
  ConfidentialAssetId local_110;
  BlindFactor local_e8;
  BlindFactor local_c8;
  ConfidentialValue local_a8;
  ConfidentialTransactionController local_80;
  
  local_210 = (char *)0x0;
  local_218 = (char *)0x0;
  local_220 = (char *)0x0;
  local_228 = (char *)0x0;
  local_230 = (char *)0x0;
  local_238 = (char *)0x0;
  local_208 = handle;
  local_200 = asset;
  cfd::Initialize();
  bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar3) {
    std::__cxx11::string::string((string *)local_1f8,tx_hex_string,(allocator *)&local_110);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              (&local_80,(string *)local_1f8);
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_);
    }
    cfd::core::Privkey::Privkey(&local_148);
    cfd::core::Privkey::Privkey(&local_168);
    bVar3 = cfd::capi::IsEmptyString(asset_blinding_key);
    if (!bVar3) {
      std::__cxx11::string::string((string *)&local_110,asset_blinding_key,(allocator *)local_258);
      cfd::core::Privkey::Privkey((Privkey *)local_1f8,(string *)&local_110,kMainnet,true);
      puVar1 = local_148.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_148.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_1f8._0_8_;
      local_148.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1f8._8_8_;
      local_148.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1f8._16_8_;
      local_1f8._0_8_ = (pointer)0x0;
      local_1f8._8_8_ = (pointer)0x0;
      local_1f8._16_8_ = 0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      local_148.is_compressed_ = (bool)local_1f8[0x18];
      local_148._25_3_ = local_1f8._25_3_;
      local_148.net_type_ = local_1f8._28_4_;
      if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if (local_110._vptr_ConfidentialAssetId !=
          (_func_int **)
          ((long)&local_110.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_110._vptr_ConfidentialAssetId);
      }
    }
    bVar3 = cfd::capi::IsEmptyString(token_blinding_key);
    if (!bVar3) {
      std::__cxx11::string::string((string *)&local_110,token_blinding_key,(allocator *)local_258);
      cfd::core::Privkey::Privkey((Privkey *)local_1f8,(string *)&local_110,kMainnet,true);
      puVar1 = local_168.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_1f8._0_8_;
      local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1f8._8_8_;
      local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1f8._16_8_;
      local_1f8._0_8_ = (pointer)0x0;
      local_1f8._8_8_ = (pointer)0x0;
      local_1f8._16_8_ = 0;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      local_168.is_compressed_ = (bool)local_1f8[0x18];
      local_168._25_3_ = local_1f8._25_3_;
      local_168.net_type_ = local_1f8._28_4_;
      if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if (local_110._vptr_ConfidentialAssetId !=
          (_func_int **)
          ((long)&local_110.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_110._vptr_ConfidentialAssetId);
      }
    }
    cfd::ConfidentialTransactionController::UnblindIssuance
              (&local_128,&local_80,tx_in_index,&local_148,&local_168);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_1f8);
    cfd::core::BlindFactor::BlindFactor(&local_1d0);
    cfd::core::BlindFactor::BlindFactor(&local_1b0);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_190);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_110);
    cfd::core::BlindFactor::BlindFactor(&local_e8);
    cfd::core::BlindFactor::BlindFactor(&local_c8);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_a8);
    pUVar2 = local_128.
             super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_128.
              super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_128.
              super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x120) {
      cfd::core::ConfidentialAssetId::operator=
                ((ConfidentialAssetId *)local_1f8,
                 &(local_128.
                   super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                   ._M_impl.super__Vector_impl_data._M_start)->asset);
      cfd::core::BlindFactor::operator=(&local_1d0,&pUVar2->abf);
      cfd::core::BlindFactor::operator=(&local_1b0,&pUVar2->vbf);
      cfd::core::ConfidentialValue::operator=(&local_190,&pUVar2->value);
      cfd::core::ConfidentialAssetId::operator=
                (&local_110,
                 &local_128.
                  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].asset);
      cfd::core::BlindFactor::operator=
                (&local_e8,
                 &local_128.
                  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].abf);
      cfd::core::BlindFactor::operator=
                (&local_c8,
                 &local_128.
                  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].vbf);
      cfd::core::ConfidentialValue::operator=
                (&local_a8,
                 &local_128.
                  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].value);
    }
    bVar3 = cfd::core::ConfidentialAssetId::IsEmpty((ConfidentialAssetId *)local_1f8);
    if (!bVar3) {
      if (local_200 != (char **)0x0) {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                  ((string *)local_258,(ConfidentialAssetId *)local_1f8);
        local_210 = cfd::capi::CreateString((string *)local_258);
        if ((char *)local_258._0_8_ != local_248) {
          operator_delete((void *)local_258._0_8_);
        }
      }
      if (asset_value != (int64_t *)0x0) {
        AVar5 = cfd::core::ConfidentialValue::GetAmount(&local_190);
        local_258._0_8_ = AVar5.amount_;
        local_258[8] = AVar5.ignore_check_;
        iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_258);
        *asset_value = iVar4;
      }
      if (asset_blind_factor != (char **)0x0) {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_258,&local_1d0);
        local_218 = cfd::capi::CreateString((string *)local_258);
        if ((char *)local_258._0_8_ != local_248) {
          operator_delete((void *)local_258._0_8_);
        }
      }
      if (asset_value_blind_factor != (char **)0x0) {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_258,&local_1b0);
        local_220 = cfd::capi::CreateString((string *)local_258);
        if ((char *)local_258._0_8_ != local_248) {
          operator_delete((void *)local_258._0_8_);
        }
      }
    }
    bVar3 = cfd::core::ConfidentialAssetId::IsEmpty(&local_110);
    if (!bVar3) {
      if (token != (char **)0x0) {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_258,&local_110);
        local_228 = cfd::capi::CreateString((string *)local_258);
        if ((char *)local_258._0_8_ != local_248) {
          operator_delete((void *)local_258._0_8_);
        }
      }
      if (token_value != (int64_t *)0x0) {
        AVar5 = cfd::core::ConfidentialValue::GetAmount(&local_a8);
        local_258._0_8_ = AVar5.amount_;
        local_258[8] = AVar5.ignore_check_;
        iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_258);
        *token_value = iVar4;
      }
      if (token_blind_factor != (char **)0x0) {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_258,&local_e8);
        local_230 = cfd::capi::CreateString((string *)local_258);
        if ((char *)local_258._0_8_ != local_248) {
          operator_delete((void *)local_258._0_8_);
        }
      }
      if (token_value_blind_factor != (char **)0x0) {
        cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_258,&local_c8);
        local_238 = cfd::capi::CreateString((string *)local_258);
        if ((char *)local_258._0_8_ != local_248) {
          operator_delete((void *)local_258._0_8_);
        }
      }
    }
    if (local_210 != (char *)0x0) {
      *local_200 = local_210;
    }
    if (local_218 != (char *)0x0) {
      *asset_blind_factor = local_218;
    }
    if (local_220 != (char *)0x0) {
      *asset_value_blind_factor = local_220;
    }
    if (local_228 != (char *)0x0) {
      *token = local_228;
    }
    if (local_230 != (char *)0x0) {
      *token_blind_factor = local_230;
    }
    if (local_238 != (char *)0x0) {
      *token_value_blind_factor = local_238;
    }
    local_a8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
    if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_c8._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
    if (local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_e8._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
    if (local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_110._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
    if (local_110.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_190._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
    if (local_190.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_190.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1b0._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
    if (local_1b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1d0._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
    if (local_1d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1f8._0_8_ = &PTR__ConfidentialAssetId_00735710;
    if ((pointer)local_1f8._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_1f8._8_8_);
    }
    std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
              (&local_128);
    if (local_168.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_148.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_80.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&PTR__ConfidentialTransactionController_00735388;
    cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_80.transaction_);
    return 0;
  }
  local_1f8._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_1f8._8_4_ = 0x7d8;
  local_1f8._16_8_ = "CfdUnblindIssuance";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_1f8,kCfdLogLevelWarning,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_1f8._0_8_ = local_1f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f8,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_1f8);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUnblindIssuance(
    void* handle, const char* tx_hex_string, uint32_t tx_in_index,
    const char* asset_blinding_key, const char* token_blinding_key,
    char** asset, int64_t* asset_value, char** asset_blind_factor,
    char** asset_value_blind_factor, char** token, int64_t* token_value,
    char** token_blind_factor, char** token_value_blind_factor) {
  char* work_asset = nullptr;
  char* work_asset_blind_factor = nullptr;
  char* work_asset_value_blind_factor = nullptr;
  char* work_token = nullptr;
  char* work_token_blind_factor = nullptr;
  char* work_token_value_blind_factor = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    Privkey asset_key;
    Privkey token_key;
    if (!IsEmptyString(asset_blinding_key)) {
      asset_key = Privkey(asset_blinding_key);
    }
    if (!IsEmptyString(token_blinding_key)) {
      token_key = Privkey(token_blinding_key);
    }

    std::vector<UnblindParameter> unblind_datas =
        ctxc.UnblindIssuance(tx_in_index, asset_key, token_key);

    UnblindParameter unblind_asset;
    UnblindParameter unblind_token;
    if (unblind_datas.size() == 2) {  // 2固定
      unblind_asset = unblind_datas[0];
      unblind_token = unblind_datas[1];
    }

    if (!unblind_asset.asset.IsEmpty()) {
      if (asset != nullptr) {
        work_asset = CreateString(unblind_asset.asset.GetHex());
      }
      if (asset_value != nullptr) {
        *asset_value = unblind_asset.value.GetAmount().GetSatoshiValue();
      }
      if (asset_blind_factor != nullptr) {
        work_asset_blind_factor = CreateString(unblind_asset.abf.GetHex());
      }
      if (asset_value_blind_factor != nullptr) {
        work_asset_value_blind_factor =
            CreateString(unblind_asset.vbf.GetHex());
      }
    }
    if (!unblind_token.asset.IsEmpty()) {
      if (token != nullptr) {
        work_token = CreateString(unblind_token.asset.GetHex());
      }
      if (token_value != nullptr) {
        *token_value = unblind_token.value.GetAmount().GetSatoshiValue();
      }
      if (token_blind_factor != nullptr) {
        work_token_blind_factor = CreateString(unblind_token.abf.GetHex());
      }
      if (token_value_blind_factor != nullptr) {
        work_token_value_blind_factor =
            CreateString(unblind_token.vbf.GetHex());
      }
    }

    if (work_asset != nullptr) *asset = work_asset;
    if (work_asset_blind_factor != nullptr)
      *asset_blind_factor = work_asset_blind_factor;
    if (work_asset_value_blind_factor != nullptr)
      *asset_value_blind_factor = work_asset_value_blind_factor;
    if (work_token != nullptr) *token = work_token;
    if (work_token_blind_factor != nullptr)
      *token_blind_factor = work_token_blind_factor;
    if (work_token_value_blind_factor != nullptr)
      *token_value_blind_factor = work_token_value_blind_factor;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_asset_value_blind_factor,
        &work_token, &work_token_blind_factor, &work_token_value_blind_factor);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_asset_value_blind_factor,
        &work_token, &work_token_blind_factor, &work_token_value_blind_factor);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset, &work_asset_blind_factor, &work_asset_value_blind_factor,
        &work_token, &work_token_blind_factor, &work_token_value_blind_factor);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}